

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O2

void __thiscall CP::stack<int>::push(stack<int> *this,int *element)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = this->mSize;
  uVar2 = sVar1 + 1;
  if (this->mCap < uVar2) {
    expand(this,this->mCap * 2);
    sVar1 = this->mSize;
    uVar2 = sVar1 + 1;
  }
  this->mData[sVar1] = *element;
  this->mSize = uVar2;
  return;
}

Assistant:

void push(const T& element) {  // Theta(n)
      if (mSize + 1 > mCap) 
        expand(mCap * 2);
      mData[mSize] = element;
      mSize++;
    }